

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capi.c
# Opt level: O3

void NGA_Access_block_grid64(int g_a,int64_t *index,void *ptr,int64_t *ld)

{
  Integer IVar1;
  long lVar2;
  long lVar3;
  long g_a_00;
  Integer *ld_00;
  Integer _ga_lo [7];
  Integer _ga_work [7];
  Integer aIStack_a8 [8];
  Integer local_68 [8];
  
  g_a_00 = (long)g_a;
  IVar1 = pnga_ndim(g_a_00);
  lVar3 = IVar1;
  if (IVar1 < 1) {
    pnga_access_block_grid_ptr(g_a_00,aIStack_a8,ptr,local_68);
  }
  else {
    do {
      lVar2 = lVar3 + -1;
      local_68[lVar3 + -9] = *index;
      index = index + 1;
      lVar3 = lVar2;
    } while (lVar2 != 0);
    ld_00 = local_68;
    pnga_access_block_grid_ptr(g_a_00,aIStack_a8,ptr,ld_00);
    for (; IVar1 != 1; IVar1 = IVar1 + -1) {
      ld[IVar1 + -2] = *ld_00;
      ld_00 = ld_00 + 1;
    }
  }
  return;
}

Assistant:

void NGA_Access_block_grid64(int g_a, int64_t index[], void *ptr, int64_t ld[])
{
     Integer a=(Integer)g_a;
     Integer ndim = wnga_ndim(a);
     Integer _ga_lo[MAXDIM], _ga_work[MAXDIM];
     COPYC2F(index, _ga_lo, ndim);
     wnga_access_block_grid_ptr(a,_ga_lo,ptr,_ga_work);
     COPYF2C_64(_ga_work,ld, ndim-1);
}